

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void rbuSetupOal(sqlite3rbu *p,RbuState *pState)

{
  int iVar1;
  char *pcVar2;
  bool bVar3;
  int local_24;
  int rc;
  RbuObjIter *pIter;
  RbuState *pState_local;
  sqlite3rbu *p_local;
  
  if (pState->zTbl == (char *)0x0) {
    return;
  }
  local_24 = 0;
  do {
    bVar3 = false;
    if (((local_24 == 0) && (bVar3 = false, (p->objiter).zTbl != (char *)0x0)) &&
       (bVar3 = true, (p->objiter).bCleanup == 0)) {
      iVar1 = rbuStrCompare((p->objiter).zIdx,pState->zIdx);
      bVar3 = true;
      if (iVar1 == 0) {
        if (pState->zDataTbl == (char *)0x0) {
          iVar1 = rbuStrCompare((p->objiter).zTbl,pState->zTbl);
          bVar3 = true;
          if (iVar1 != 0) goto LAB_0022034f;
        }
        bVar3 = false;
        if (pState->zDataTbl != (char *)0x0) {
          iVar1 = rbuStrCompare((p->objiter).zDataTbl,pState->zDataTbl);
          bVar3 = iVar1 != 0;
        }
      }
    }
LAB_0022034f:
    if (!bVar3) {
      if ((local_24 == 0) && ((p->objiter).zTbl == (char *)0x0)) {
        local_24 = 1;
        pcVar2 = sqlite3_mprintf("rbu_state mismatch error");
        p->zErrmsg = pcVar2;
      }
      if (local_24 == 0) {
        p->nStep = pState->nRow;
        local_24 = rbuObjIterPrepareAll(p,&p->objiter,p->nStep);
      }
      p->rc = local_24;
      return;
    }
    local_24 = rbuObjIterNext(p,&p->objiter);
  } while( true );
}

Assistant:

static void rbuSetupOal(sqlite3rbu *p, RbuState *pState){
  assert( p->rc==SQLITE_OK );
  if( pState->zTbl ){
    RbuObjIter *pIter = &p->objiter;
    int rc = SQLITE_OK;

    while( rc==SQLITE_OK && pIter->zTbl && (pIter->bCleanup 
       || rbuStrCompare(pIter->zIdx, pState->zIdx)
       || (pState->zDataTbl==0 && rbuStrCompare(pIter->zTbl, pState->zTbl))
       || (pState->zDataTbl && rbuStrCompare(pIter->zDataTbl, pState->zDataTbl))
    )){
      rc = rbuObjIterNext(p, pIter);
    }

    if( rc==SQLITE_OK && !pIter->zTbl ){
      rc = SQLITE_ERROR;
      p->zErrmsg = sqlite3_mprintf("rbu_state mismatch error");
    }

    if( rc==SQLITE_OK ){
      p->nStep = pState->nRow;
      rc = rbuObjIterPrepareAll(p, &p->objiter, p->nStep);
    }

    p->rc = rc;
  }
}